

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType,
          size_t progNdx)

{
  char *pcVar1;
  ostream *this_00;
  undefined4 in_register_00000014;
  ostringstream local_198 [8];
  ostringstream str;
  size_t progNdx_local;
  ShaderType shaderType_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar1 = glu::getShaderTypeName((ShaderType)this);
  std::operator<<((ostream *)local_198,pcVar1);
  if (CONCAT44(in_register_00000014,shaderType) != 0) {
    this_00 = std::operator<<((ostream *)local_198,"_");
    std::ostream::operator<<(this_00,CONCAT44(in_register_00000014,shaderType));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string getShaderName (ShaderType shaderType, size_t progNdx)
{
	ostringstream str;
	str << glu::getShaderTypeName(shaderType);
	if (progNdx > 0)
		str << "_" << progNdx;
	return str.str();
}